

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_bio.cc
# Opt level: O1

int anon_unknown.dwarf_2f::AsyncWrite(BIO *bio,char *in,int inl)

{
  uint uVar1;
  AsyncBio *pAVar2;
  BIO *b;
  int *piVar3;
  ulong uVar4;
  int len;
  
  pAVar2 = GetData(bio);
  b = BIO_next((BIO *)bio);
  uVar1 = 0;
  if (b != (BIO *)0x0 && pAVar2 != (AsyncBio *)0x0) {
    BIO_clear_retry_flags(bio);
    uVar4 = pAVar2->write_quota;
    if (uVar4 == 0) {
      BIO_set_retry_write(bio);
      piVar3 = __errno_location();
      *piVar3 = 0xb;
      uVar1 = 0xffffffff;
    }
    else {
      len = (int)uVar4;
      if (pAVar2->datagram != false) {
        len = inl;
      }
      if ((ulong)(long)inl <= uVar4) {
        len = inl;
      }
      uVar1 = BIO_write(b,in,len);
      if ((int)uVar1 < 1) {
        BIO_copy_next_retry((BIO *)bio);
      }
      else {
        uVar4 = 1;
        if (pAVar2->datagram == false) {
          uVar4 = (ulong)uVar1;
        }
        pAVar2->write_quota = pAVar2->write_quota - uVar4;
      }
    }
  }
  return uVar1;
}

Assistant:

static int AsyncWrite(BIO *bio, const char *in, int inl) {
  AsyncBio *a = GetData(bio);
  BIO *next = BIO_next(bio);
  if (a == nullptr || next == nullptr) {
    return 0;
  }

  BIO_clear_retry_flags(bio);

  if (a->write_quota == 0) {
    BIO_set_retry_write(bio);
    errno = EAGAIN;
    return -1;
  }

  if (!a->datagram && static_cast<size_t>(inl) > a->write_quota) {
    inl = static_cast<int>(a->write_quota);
  }
  int ret = BIO_write(next, in, inl);
  if (ret <= 0) {
    BIO_copy_next_retry(bio);
  } else {
    a->write_quota -= (a->datagram ? 1 : ret);
  }
  return ret;
}